

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

string * __thiscall
t_go_generator::function_signature_if
          (string *__return_storage_ptr__,t_go_generator *this,t_function *tfunction,string *prefix,
          bool addError)

{
  bool bVar1;
  uint uVar2;
  string *__rhs;
  t_struct *ptVar3;
  members_type *this_00;
  t_type *type;
  long lVar4;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string errs;
  t_struct *exceptions;
  t_type *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  byte local_2a;
  byte local_29;
  string *psStack_28;
  bool addError_local;
  string *prefix_local;
  t_function *tfunction_local;
  t_go_generator *this_local;
  string *signature;
  
  local_2a = 0;
  local_29 = addError;
  psStack_28 = prefix;
  prefix_local = (string *)tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_go_generator *)__return_storage_ptr__;
  __rhs = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+(&local_70,prefix,__rhs);
  publicize(&local_50,this,&local_70,false);
  std::operator+(__return_storage_ptr__,&local_50,"(");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ctx context.Context");
  ptVar3 = t_function::get_arglist((t_function *)prefix_local);
  this_00 = t_struct::get_members(ptVar3);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(this_00);
  if (!bVar1) {
    ptVar3 = t_function::get_arglist((t_function *)prefix_local);
    argument_list_abi_cxx11_((string *)&ret,this,ptVar3);
    std::operator+(&local_a0,", ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&ret);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,") (");
  type = t_function::get_returntype((t_function *)prefix_local);
  errs.field_2._8_8_ = t_function::get_xceptions((t_function *)prefix_local);
  argument_list_abi_cxx11_((string *)local_f0,this,(t_struct *)errs.field_2._8_8_);
  uVar2 = (*(type->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    type_to_go_type_abi_cxx11_(&local_130,this,type);
    std::operator+(&local_110,"_r ",&local_130);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    if (((local_29 & 1) != 0) || (lVar4 = std::__cxx11::string::size(), lVar4 == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
  }
  if ((local_29 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_err error");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  local_2a = 1;
  std::__cxx11::string::~string((string *)local_f0);
  if ((local_2a & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::function_signature_if(t_function* tfunction, string prefix, bool addError) {
  string signature = publicize(prefix + tfunction->get_name()) + "(";
  signature += "ctx context.Context";
  if (!tfunction->get_arglist()->get_members().empty()) {
    signature += ", " + argument_list(tfunction->get_arglist());
  }
  signature += ") (";

  t_type* ret = tfunction->get_returntype();
  t_struct* exceptions = tfunction->get_xceptions();
  string errs = argument_list(exceptions);

  if (!ret->is_void()) {
    signature += "_r " + type_to_go_type(ret);

    if (addError || errs.size() == 0) {
      signature += ", ";
    }
  }

  if (addError) {
    signature += "_err error";
  }

  signature += ")";
  return signature;
}